

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall
CVmObjGramProd::getp_addAlt(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  vm_obj_id_t obj;
  int iVar2;
  ushort *puVar3;
  vm_val_t *pvVar4;
  CVmDynamicCompiler *this_00;
  uint uVar5;
  vm_val_t *this_01;
  vm_obj_id_t obj_00;
  vm_obj_id_t local_78;
  CVmGramCompResults results;
  
  if (oargc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *oargc;
  }
  if ((getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    getp_addAlt::desc.min_argc_ = 2;
    getp_addAlt::desc.opt_argc_ = 2;
    getp_addAlt::desc.varargs_ = 0;
    __cxa_guard_release(&getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_addAlt::desc);
  if (iVar2 != 0) {
    return 1;
  }
  this_01 = sp_ + -1;
  puVar3 = (ushort *)vm_val_t::get_as_string(this_01);
  if (puVar3 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  if (sp_[-2].typ == VM_OBJ) {
    uVar1 = *puVar3;
    obj = sp_[-2].val.obj;
    iVar2 = CVmObjTads::is_tadsobj_obj(obj);
    if (iVar2 != 0) {
      obj_00 = 0;
      if (uVar5 < 3) {
        local_78 = 0;
        pvVar4 = sp_;
      }
      else {
        local_78 = 0;
        if (sp_[-3].typ == VM_NIL) {
          obj_00 = 0;
        }
        else {
          if (sp_[-3].typ != VM_OBJ) {
LAB_0025559c:
            err_throw(0x7e6);
          }
          obj_00 = sp_[-3].val.obj;
          iVar2 = CVmObjDict::is_dictionary_obj(obj_00);
          if (iVar2 == 0) goto LAB_0025559c;
        }
        pvVar4 = sp_;
        if ((uVar5 != 3) && (sp_[-4].typ != VM_NIL)) {
          if (sp_[-4].typ != VM_OBJ) {
            err_throw(0x7da);
          }
          local_78 = sp_[-4].val.obj;
        }
      }
      sp_ = pvVar4 + 1;
      pvVar4->typ = VM_OBJ;
      (pvVar4->val).obj = self;
      results.super_CVmDynCompResults.err = 0;
      results.super_CVmDynCompResults.msgbuf = (char *)0x0;
      results.super_CVmDynCompResults._vptr_CVmDynCompResults =
           (_func_int **)&PTR__CVmDynCompResults_0031c760;
      results.self = self;
      results.selfp = this;
      results.dict = obj_00;
      results.match = obj;
      this_00 = CVmDynamicCompiler::get();
      CVmDynamicCompiler::compile
                (this_00,0,local_78,0,0,this_01,(char *)(puVar3 + 1),(ulong)uVar1,DCModeGramAlt,
                 (CVmDynCompDebug *)0x0,&results.super_CVmDynCompResults);
      if (results.super_CVmDynCompResults.err != 0) {
        CVmDynCompResults::throw_error(&results.super_CVmDynCompResults);
      }
      build_alt_props(this,obj);
      sp_ = sp_ + -(long)(int)(uVar5 + 1);
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      CVmDynCompResults::~CVmDynCompResults(&results.super_CVmDynCompResults);
      return 1;
    }
  }
  err_throw(0x900);
}

Assistant:

int CVmObjGramProd::getp_addAlt(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;
    
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* the first argument is the rule list */
    const vm_val_t *alt = G_stk->get(0);
    const char *altp = alt->get_as_string(vmg0_);
    if (altp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the source length and buffer pointer */
    size_t altlen = vmb_get_len(altp);
    altp += VMB_LEN;

    /* the next argument is the match object class */
    vm_obj_id_t match = VM_INVALID_OBJ;
    v = G_stk->get(1);
    if (v->typ != VM_OBJ
        || !CVmObjTads::is_tadsobj_obj(vmg_ match = v->val.obj))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* next comes the optional dictionary argument */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 3
        && (v = G_stk->get(2))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ (dict = v->val.obj))))
        err_throw(VMERR_INVAL_OBJ_TYPE);

    /* next comes the optional symbol table */
    vm_obj_id_t symtab = VM_INVALID_OBJ;
    if (argc >= 4 && (v = G_stk->get(3))->typ != VM_NIL)
    {
        /* get the value, and make sure it's an object */
        symtab = v->val.obj;
        if (v->typ != VM_OBJ)
            err_throw(VMERR_OBJ_VAL_REQD);
    }

    /* push self for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* dynamically compile the alt list */
    CVmGramCompResults results(self, this, dict, match);
    CVmDynamicCompiler *comp = CVmDynamicCompiler::get(vmg0_);
    comp->compile(vmg_ FALSE, symtab, VM_INVALID_OBJ, VM_INVALID_OBJ,
                  alt, altp, altlen, DCModeGramAlt, 0, &results);

    /* check for errors */
    if (results.err != 0)
        results.throw_error(vmg0_);

    /* rebuild the grammarAltProps property for the match object */
    build_alt_props(vmg_ match);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* return self */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}